

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInit.c
# Opt level: O1

DdManager *
Cudd_Init(uint numVars,uint numVarsZ,uint numSlots,uint cacheSize,unsigned_long maxMemory)

{
  int *piVar1;
  _func_void_long *p_Var2;
  int iVar3;
  DdManager *unique;
  char *pcVar4;
  DdNode *pDVar5;
  DdNode **ppDVar6;
  DdNode *pDVar7;
  long lVar8;
  
  if (maxMemory == 0) {
    iVar3 = Extra_GetSoftDataLimit();
    maxMemory = (unsigned_long)iVar3;
  }
  unique = cuddInitTable(numVars,numVarsZ,numSlots,(uint)(maxMemory / 200));
  if (unique != (DdManager *)0x0) {
    unique->maxmem = (maxMemory / 10) * 9;
    iVar3 = cuddInitCache(unique,cacheSize,(uint)(maxMemory / 0x78));
    p_Var2 = Extra_UtilMMoutOfMemory;
    if (iVar3 != 0) {
      Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
      pcVar4 = (char *)malloc((maxMemory >> 6) + 4);
      unique->stash = pcVar4;
      Extra_UtilMMoutOfMemory = p_Var2;
      if (pcVar4 == (char *)0x0) {
        fwrite("Unable to set aside memory\n",0x1b,1,(FILE *)unique->err);
      }
      pDVar5 = cuddUniqueConst(unique,1.0);
      unique->one = pDVar5;
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar5 = cuddUniqueConst(unique,0.0);
        unique->zero = pDVar5;
        if (pDVar5 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar5 = cuddUniqueConst(unique,1e+302);
          unique->plusinfinity = pDVar5;
          if (pDVar5 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar5 = cuddUniqueConst(unique,-1e+302);
            unique->minusinfinity = pDVar5;
            if (pDVar5 != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar5 = unique->one;
              unique->background = unique->zero;
              ppDVar6 = (DdNode **)malloc((long)unique->maxSize << 3);
              unique->vars = ppDVar6;
              if (ppDVar6 != (DdNode **)0x0) {
                if (0 < unique->size) {
                  lVar8 = 0;
                  do {
                    pDVar7 = cuddUniqueInter(unique,(int)lVar8,pDVar5,(DdNode *)((ulong)pDVar5 ^ 1))
                    ;
                    unique->vars[lVar8] = pDVar7;
                    if (unique->vars[lVar8] == (DdNode *)0x0) {
                      return (DdManager *)0x0;
                    }
                    piVar1 = (int *)(((ulong)unique->vars[lVar8] & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + 1;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 < unique->size);
                }
                if (unique->sizeZ != 0) {
                  cuddZddInitUniv(unique);
                }
                unique->memused = unique->memused + (long)unique->maxSize * 8;
                unique->bFunc = (DdNode *)0x0;
                unique->bFunc2 = (DdNode *)0x0;
                unique->TimeStop = 0;
                return unique;
              }
              unique->errorCode = CUDD_MEMORY_OUT;
            }
          }
        }
      }
    }
  }
  return (DdManager *)0x0;
}

Assistant:

DdManager *
Cudd_Init(
  unsigned int numVars /* initial number of BDD variables (i.e., subtables) */,
  unsigned int numVarsZ /* initial number of ZDD variables (i.e., subtables) */,
  unsigned int numSlots /* initial size of the unique tables */,
  unsigned int cacheSize /* initial size of the cache */,
  unsigned long maxMemory /* target maximum memory occupation */)
{
    DdManager *unique;
    int i,result;
    DdNode *one, *zero;
    unsigned int maxCacheSize;
    unsigned int looseUpTo;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (maxMemory == 0) {
        maxMemory = getSoftDataLimit();
    }
    looseUpTo = (unsigned int) ((maxMemory / sizeof(DdNode)) /
                                DD_MAX_LOOSE_FRACTION);
    unique = cuddInitTable(numVars,numVarsZ,numSlots,looseUpTo);
    if (unique == NULL) return(NULL);
    unique->maxmem = (unsigned long) maxMemory / 10 * 9;
    maxCacheSize = (unsigned int) ((maxMemory / sizeof(DdCache)) /
                                   DD_MAX_CACHE_FRACTION);
    result = cuddInitCache(unique,cacheSize,maxCacheSize);
    if (result == 0) return(NULL);

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
    unique->stash = ABC_ALLOC(char,(maxMemory / DD_STASH_FRACTION) + 4);
    MMoutOfMemory = saveHandler;
    if (unique->stash == NULL) {
        (void) fprintf(unique->err,"Unable to set aside memory\n");
    }

    /* Initialize constants. */
    unique->one = cuddUniqueConst(unique,1.0);
    if (unique->one == NULL) return(0);
    cuddRef(unique->one);
    unique->zero = cuddUniqueConst(unique,0.0);
    if (unique->zero == NULL) return(0);
    cuddRef(unique->zero);
#ifdef HAVE_IEEE_754
    if (DD_PLUS_INF_VAL != DD_PLUS_INF_VAL * 3 ||
        DD_PLUS_INF_VAL != DD_PLUS_INF_VAL / 3) {
        (void) fprintf(unique->err,"Warning: Crippled infinite values\n");
        (void) fprintf(unique->err,"Recompile without -DHAVE_IEEE_754\n");
    }
#endif
    unique->plusinfinity = cuddUniqueConst(unique,DD_PLUS_INF_VAL);
    if (unique->plusinfinity == NULL) return(0);
    cuddRef(unique->plusinfinity);
    unique->minusinfinity = cuddUniqueConst(unique,DD_MINUS_INF_VAL);
    if (unique->minusinfinity == NULL) return(0);
    cuddRef(unique->minusinfinity);
    unique->background = unique->zero;

    /* The logical zero is different from the CUDD_VALUE_TYPE zero! */
    one = unique->one;
    zero = Cudd_Not(one);
    /* Create the projection functions. */
    unique->vars = ABC_ALLOC(DdNodePtr,unique->maxSize);
    if (unique->vars == NULL) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < unique->size; i++) {
        unique->vars[i] = cuddUniqueInter(unique,i,one,zero);
        if (unique->vars[i] == NULL) return(0);
        cuddRef(unique->vars[i]);
    }

    if (unique->sizeZ)
        cuddZddInitUniv(unique);

    unique->memused += sizeof(DdNode *) * unique->maxSize;

    unique->bFunc = NULL;
    unique->bFunc2 = NULL;
    unique->TimeStop = 0;
    return(unique);

}